

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void am_write_command_name(Am_Object *cmd,int cnt,ostrstream *oss)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  Am_Object object_modified;
  Am_Value new_value;
  Am_Value v;
  Am_Value object_modified_value;
  Am_Value AStack_58;
  Am_Value local_48;
  Am_Value local_38;
  Am_Value local_28;
  
  local_38.type = 0;
  local_38.value.wrapper_value = (Am_Wrapper *)0x0;
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  local_48.type = 0;
  local_48.value.wrapper_value = (Am_Wrapper *)0x0;
  AStack_58.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(cmd,0x151,5);
  Am_Value::operator=(&local_38,pAVar3);
  bVar1 = Am_Value::Valid(&local_38);
  if (!bVar1) {
    pAVar3 = Am_Object::Get(cmd,0x150,5);
    Am_Value::operator=(&local_38,pAVar3);
  }
  pAVar3 = Am_Object::Get(cmd,0x16d,5);
  Am_Value::operator=(&local_28,pAVar3);
  pAVar3 = Am_Object::Get(cmd,0x169,5);
  Am_Value::operator=(&local_48,pAVar3);
  std::ostream::operator<<(oss,cnt);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,". ",2);
  poVar4 = operator<<((ostream *)oss,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  bVar1 = Am_Value::Valid(&local_28);
  if (bVar1) {
    output_obj_or_list(&AStack_58,(ostrstream *)&local_28);
    Am_Object::operator=((Am_Object *)&AStack_58.value,(Am_Object *)&AStack_58);
    Am_Object::~Am_Object((Am_Object *)&AStack_58);
  }
  bVar1 = Am_Value::Exists(&local_48);
  if (bVar1) {
    bVar1 = Am_Object::Valid((Am_Object *)&AStack_58.value);
    if (bVar1 && local_48.type == 0xa001) {
      Am_Object::Am_Object((Am_Object *)&AStack_58,&local_48);
      bVar2 = Am_Object::operator!=((Am_Object *)&AStack_58,(Am_Object *)&AStack_58.value);
      bVar1 = true;
    }
    else {
      bVar2 = true;
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
    bVar2 = false;
  }
  if (bVar1) {
    Am_Object::~Am_Object((Am_Object *)&AStack_58);
  }
  if (bVar2 != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss," = ",3);
    operator<<((ostream *)oss,&local_48);
  }
  std::ostream::put((char)oss);
  Am_Object::~Am_Object((Am_Object *)&AStack_58.value);
  Am_Value::~Am_Value(&local_48);
  Am_Value::~Am_Value(&local_28);
  Am_Value::~Am_Value(&local_38);
  return;
}

Assistant:

void
am_write_command_name(Am_Object cmd, int cnt, OSTRSTREAM &oss)
{
  Am_Value v, object_modified_value, new_value;
  Am_Object object_modified;
  v = cmd.Peek(Am_SHORT_LABEL, Am_NO_DEPENDENCY);
  if (!v.Valid())
    v = cmd.Peek(Am_LABEL, Am_NO_DEPENDENCY);
  object_modified_value = cmd.Peek(Am_OBJECT_MODIFIED, Am_NO_DEPENDENCY);
  new_value = cmd.Peek(Am_VALUE, Am_NO_DEPENDENCY);
  oss << cnt;
  oss << ". " << v << " ";
  if (object_modified_value.Valid())
    object_modified = output_obj_or_list(object_modified_value, oss);
  if (new_value.Exists() &&
      (!object_modified.Valid() || new_value.type != Am_OBJECT ||
       Am_Object(new_value) != object_modified)) {
    //don't output new_value if same as object_modified (as in create commands)
    oss << " = " << new_value;
  }
  oss << std::ends;
}